

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall IR::Instr::CanAggregateByteCodeUsesAcrossInstr(Instr *this,Instr *instr)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  bool local_29;
  bool local_19;
  Instr *instr_local;
  Instr *this_local;
  
  bVar1 = StartsBasicBlock(instr);
  local_19 = false;
  if ((!bVar1) && (local_19 = false, instr->m_func == this->m_func)) {
    uVar2 = GetByteCodeOffset(instr);
    local_29 = true;
    if (uVar2 != 0xffffffff) {
      uVar2 = GetByteCodeOffset(instr);
      uVar3 = GetByteCodeOffset(this);
      local_29 = uVar2 == uVar3;
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

bool Instr::CanAggregateByteCodeUsesAcrossInstr(Instr * instr)
{
    return !instr->StartsBasicBlock() && 
        instr->m_func == this->m_func &&
        ((instr->GetByteCodeOffset() == Js::Constants::NoByteCodeOffset) ||
        (instr->GetByteCodeOffset() == this->GetByteCodeOffset()));
}